

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O0

void Cec_ManRefinedClassPrintStats(Gia_Man_t *p,Vec_Str_t *vStatus,int iIter,abctime Time)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pObj;
  undefined8 uVar5;
  uint local_4c;
  uint local_48;
  int nFail;
  int nDispr;
  int nProve;
  int Entry;
  int i;
  int Counter;
  int Counter0;
  int CounterX;
  int nLits;
  abctime Time_local;
  int iIter_local;
  Vec_Str_t *vStatus_local;
  Gia_Man_t *p_local;
  
  Counter = 0;
  i = 0;
  Entry = 0;
  nFail = 0;
  local_48 = 0;
  local_4c = 0;
  for (nProve = 1; iVar2 = Gia_ManObjNum(p), nProve < iVar2; nProve = nProve + 1) {
    iVar2 = Gia_ObjIsNone(p,nProve);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsConst(p,nProve);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsHead(p,nProve);
        if (iVar2 != 0) {
          Entry = Entry + 1;
        }
      }
      else {
        i = i + 1;
      }
    }
    else {
      Counter = Counter + 1;
    }
  }
  iVar2 = Gia_ManCoNum(p);
  iVar3 = Gia_ManCiNum(p);
  iVar4 = Gia_ManAndNum(p);
  if (iIter == -1) {
    Abc_Print(1,"BMC : ");
  }
  else {
    Abc_Print(1,"%3d : ",(ulong)(uint)iIter);
  }
  Abc_Print(1,"c =%8d  cl =%7d  lit =%8d  ",(ulong)(uint)i,(ulong)(uint)Entry,
            (ulong)(uint)(((iVar3 + iVar4) - Entry) - (Counter - iVar2)));
  if (vStatus != (Vec_Str_t *)0x0) {
    for (nProve = 0; iVar2 = Vec_StrSize(vStatus), nProve < iVar2; nProve = nProve + 1) {
      cVar1 = Vec_StrEntry(vStatus,nProve);
      if (cVar1 == '\x01') {
        nFail = nFail + 1;
      }
      else if (cVar1 == '\0') {
        local_48 = local_48 + 1;
      }
      else if (cVar1 == -1) {
        local_4c = local_4c + 1;
      }
    }
  }
  Abc_Print(1,"p =%6d  d =%6d  f =%6d  ",(ulong)(uint)nFail,(ulong)local_48,(ulong)local_4c);
  pObj = Gia_ManPo(p,0);
  iVar2 = Gia_ObjFaninId0p(p,pObj);
  iVar2 = Gia_ObjIsConst(p,iVar2);
  uVar5 = 0x2d;
  if (iVar2 != 0) {
    uVar5 = 0x2b;
  }
  Abc_Print(1,"%c  ",uVar5);
  Abc_PrintTime(1,"T",Time);
  return;
}

Assistant:

void Cec_ManRefinedClassPrintStats( Gia_Man_t * p, Vec_Str_t * vStatus, int iIter, abctime Time )
{ 
    int nLits, CounterX = 0, Counter0 = 0, Counter = 0;
    int i, Entry, nProve = 0, nDispr = 0, nFail = 0;
    for ( i = 1; i < Gia_ManObjNum(p); i++ )
    {
        if ( Gia_ObjIsNone(p, i) )
            CounterX++;
        else if ( Gia_ObjIsConst(p, i) )
            Counter0++;
        else if ( Gia_ObjIsHead(p, i) )
            Counter++;
    }
    CounterX -= Gia_ManCoNum(p);
    nLits = Gia_ManCiNum(p) + Gia_ManAndNum(p) - Counter - CounterX;
    if ( iIter == -1 )
        Abc_Print( 1, "BMC : " );
    else
        Abc_Print( 1, "%3d : ", iIter );
    Abc_Print( 1, "c =%8d  cl =%7d  lit =%8d  ", Counter0, Counter, nLits );
    if ( vStatus )
    Vec_StrForEachEntry( vStatus, Entry, i )
    {
        if ( Entry == 1 )
            nProve++;
        else if ( Entry == 0 )
            nDispr++;
        else if ( Entry == -1 )
            nFail++;
    }
    Abc_Print( 1, "p =%6d  d =%6d  f =%6d  ", nProve, nDispr, nFail );
    Abc_Print( 1, "%c  ", Gia_ObjIsConst( p, Gia_ObjFaninId0p(p, Gia_ManPo(p, 0)) ) ? '+' : '-' );
    Abc_PrintTime( 1, "T", Time );
}